

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O1

size_t al_ustr_encode_utf16(ALLEGRO_USTR *us,uint16_t *s,size_t n)

{
  bool bVar1;
  bool bVar2;
  ushort uVar3;
  uint in_EAX;
  uint uVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  int pos;
  undefined8 uStack_38;
  
  uStack_38 = (ulong)in_EAX;
  lVar5 = 0;
  do {
    uVar4 = al_ustr_get_next(us,(int *)((long)&uStack_38 + 4));
    if ((int)uVar4 < 0) {
LAB_00182b51:
      bVar1 = false;
    }
    else {
      if (uVar4 < 0x10000) {
        lVar6 = 2;
        uVar3 = 0;
        bVar2 = false;
        uVar7 = uVar4;
      }
      else if (uVar4 < 0x110000) {
        uVar7 = uVar4 + 0xff0000 >> 10 | 0xd800;
        uVar3 = (ushort)uVar4 & 0x3ff | 0xdc00;
        lVar6 = 4;
        bVar2 = true;
      }
      else {
        uVar3 = 0;
        uVar7 = 0;
        bVar2 = false;
        lVar6 = 0;
      }
      if (n - 2 < (ulong)(lVar6 + lVar5 * 2)) goto LAB_00182b51;
      s[lVar5] = (uint16_t)uVar7;
      bVar1 = true;
      if (bVar2) {
        s[lVar5 + 1] = uVar3;
        lVar5 = lVar5 + 2;
      }
      else {
        lVar5 = lVar5 + 1;
      }
    }
    if (!bVar1) {
      if (lVar5 * 2 + 1U < n) {
        s[lVar5] = 0;
        lVar5 = lVar5 + 1;
      }
      return lVar5 * 2;
    }
  } while( true );
}

Assistant:

size_t al_ustr_encode_utf16(const ALLEGRO_USTR *us, uint16_t *s,
   size_t n)
{
   int pos = 0;
   size_t i = 0;
   while (1) {
      /* Used to hold one encoded UTF-16 character. */
      uint16_t encoded[2] = {0, 0};
      size_t sz;
      int32_t c = al_ustr_get_next(us, &pos);
      if (c < 0)
         break;
      sz = al_utf16_encode(encoded, c);
      /* Need two bytes for terminating 0. */
      if (i * 2 + sz > n - 2)
         break;
      s[i++] = encoded[0];
      if (sz == 4)
         s[i++] = encoded[1];
   }
   /* Append terminating 0 - al_ustr_get_next withheld it. */
   if (i * 2 + 1 < n)
      s[i++] = 0;

   return i * 2;
}